

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O0

void __thiscall
diff_match_patch_test::assertEquals
          (diff_match_patch_test *this,wstring *strCase,deque<Diff,_std::allocator<Diff>_> *list1,
          deque<Diff,_std::allocator<Diff>_> *list2)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  size_type sVar4;
  size_type sVar5;
  const_reference pvVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  wstring *this_00;
  wstring local_1e8 [32];
  reference local_1c8;
  Diff *d2_1;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  deque<Diff,_std::allocator<Diff>_> *__range2_2;
  wstring local_170 [8];
  wstring listString2;
  Diff *d1_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  deque<Diff,_std::allocator<Diff>_> *__range2_1;
  wstring local_d8 [6];
  bool first;
  wstring listString1;
  undefined1 local_a8 [8];
  Diff d2;
  Diff *d1;
  const_iterator __end2;
  const_iterator __begin2;
  deque<Diff,_std::allocator<Diff>_> *__range2;
  int i;
  bool fail;
  deque<Diff,_std::allocator<Diff>_> *list2_local;
  deque<Diff,_std::allocator<Diff>_> *list1_local;
  wstring *strCase_local;
  diff_match_patch_test *this_local;
  
  bVar3 = false;
  sVar4 = std::deque<Diff,_std::allocator<Diff>_>::size(list1);
  sVar5 = std::deque<Diff,_std::allocator<Diff>_>::size(list2);
  if (sVar4 == sVar5) {
    __range2._0_4_ = 0;
    std::deque<Diff,_std::allocator<Diff>_>::begin((const_iterator *)&__end2._M_node,list1);
    std::deque<Diff,_std::allocator<Diff>_>::end((const_iterator *)&d1,list1);
    while (bVar1 = std::operator!=((_Self *)&__end2._M_node,(_Self *)&d1), bVar1) {
      d2.text.field_2._8_8_ =
           std::_Deque_iterator<Diff,_const_Diff_&,_const_Diff_*>::operator*
                     ((_Deque_iterator<Diff,_const_Diff_&,_const_Diff_*> *)&__end2._M_node);
      pvVar6 = std::deque<Diff,_std::allocator<Diff>_>::operator[](list2,(long)(int)__range2);
      Diff::Diff((Diff *)local_a8,pvVar6);
      bVar2 = Diff::operator!=((Diff *)d2.text.field_2._8_8_,(Diff *)local_a8);
      if ((bVar2 & 1) == 0) {
        __range2._0_4_ = (int)__range2 + 1;
        listString1.field_2._M_local_buf[2] = L'\0';
      }
      else {
        bVar3 = true;
        listString1.field_2._M_local_buf[2] = L'\x02';
      }
      Diff::~Diff((Diff *)local_a8);
      if (listString1.field_2._M_local_buf[2] != L'\0') break;
      std::_Deque_iterator<Diff,_const_Diff_&,_const_Diff_*>::operator++
                ((_Deque_iterator<Diff,_const_Diff_&,_const_Diff_*> *)&__end2._M_node);
    }
  }
  else {
    bVar3 = true;
  }
  if (!bVar3) {
    ResetOutputStream();
    uVar7 = std::__cxx11::wstring::c_str();
    wprintf(L"%ls OK",uVar7);
    wprintf(L"\n");
    return;
  }
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            (local_d8,L"(L",(allocator<wchar_t> *)((long)&__range2_1 + 7));
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)((long)&__range2_1 + 7));
  __range2_1._6_1_ = 1;
  std::deque<Diff,_std::allocator<Diff>_>::begin((const_iterator *)&__end2_1._M_node,list1);
  std::deque<Diff,_std::allocator<Diff>_>::end((const_iterator *)&d1_1,list1);
  while (bVar3 = std::operator!=((_Self *)&__end2_1._M_node,(_Self *)&d1_1), bVar3) {
    std::_Deque_iterator<Diff,_const_Diff_&,_const_Diff_*>::operator*
              ((_Deque_iterator<Diff,_const_Diff_&,_const_Diff_*> *)&__end2_1._M_node);
    if ((__range2_1._6_1_ & 1) == 0) {
      std::__cxx11::wstring::operator+=(local_d8,L", L");
    }
    Diff::toString_abi_cxx11_();
    std::__cxx11::wstring::operator+=(local_d8,(wstring *)((long)&listString2.field_2 + 8));
    std::__cxx11::wstring::~wstring((wstring *)((long)&listString2.field_2 + 8));
    __range2_1._6_1_ = 0;
    std::_Deque_iterator<Diff,_const_Diff_&,_const_Diff_*>::operator++
              ((_Deque_iterator<Diff,_const_Diff_&,_const_Diff_*> *)&__end2_1._M_node);
  }
  std::__cxx11::wstring::operator+=(local_d8,L")");
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            (local_170,L"(L",(allocator<wchar_t> *)((long)&__range2_2 + 7));
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)((long)&__range2_2 + 7));
  __range2_1._6_1_ = 1;
  std::deque<Diff,_std::allocator<Diff>_>::begin((const_iterator *)&__end2_2._M_node,list2);
  std::deque<Diff,_std::allocator<Diff>_>::end((const_iterator *)&d2_1,list2);
  while (bVar3 = std::operator!=((_Self *)&__end2_2._M_node,(_Self *)&d2_1), bVar3) {
    local_1c8 = std::_Deque_iterator<Diff,_const_Diff_&,_const_Diff_*>::operator*
                          ((_Deque_iterator<Diff,_const_Diff_&,_const_Diff_*> *)&__end2_2._M_node);
    if ((__range2_1._6_1_ & 1) == 0) {
      std::__cxx11::wstring::operator+=(local_170,L", L");
    }
    Diff::toString_abi_cxx11_();
    std::__cxx11::wstring::operator+=(local_170,local_1e8);
    std::__cxx11::wstring::~wstring(local_1e8);
    __range2_1._6_1_ = 0;
    std::_Deque_iterator<Diff,_const_Diff_&,_const_Diff_*>::operator++
              ((_Deque_iterator<Diff,_const_Diff_&,_const_Diff_*> *)&__end2_2._M_node);
  }
  std::__cxx11::wstring::operator+=(local_170,L")");
  ResetOutputStream();
  uVar7 = std::__cxx11::wstring::c_str();
  uVar8 = std::__cxx11::wstring::c_str();
  uVar9 = std::__cxx11::wstring::c_str();
  wprintf(L"%ls FAIL\nExpected: %ls\nActual: %ls",uVar7,uVar8,uVar9);
  wprintf(L"\n");
  this_00 = (wstring *)__cxa_allocate_exception(0x20);
  std::__cxx11::wstring::wstring(this_00,(wstring *)strCase);
  __cxa_throw(this_00,&std::__cxx11::wstring::typeinfo,std::__cxx11::wstring::~wstring);
}

Assistant:

void diff_match_patch_test::assertEquals(const std::wstring &strCase, const std::deque<Diff> &list1, const std::deque<Diff> &list2) {
  bool fail = false;
  if (list1.size() == list2.size()) {
    int i = 0;
    for (const Diff& d1 : list1) {
      Diff d2 = list2[i];
      if (d1 != d2) {
        fail = true;
        break;
      }
      i++;
    }
  } else {
    fail = true;
  }

  if (fail) {
    // Build human readable description of both lists.
    std::wstring listString1 = L"(L";
    bool first = true;
    for (const Diff& d1 : list1) {
      if (!first) {
        listString1 += L", L";
      }
      listString1 += d1.toString();
      first = false;
    }
    listString1 += L")";
    std::wstring listString2 = L"(L";
    first = true;
    for (const Diff& d2 : list2) {
      if (!first) {
        listString2 += L", L";
      }
      listString2 += d2.toString();
      first = false;
    }
    listString2 += L")";
    dmpDebug(L"%ls FAIL\nExpected: %ls\nActual: %ls",
        dmpPrintable(strCase), dmpPrintable(listString1), dmpPrintable(listString2));
    throw strCase;
  }
  dmpDebug(L"%ls OK", dmpPrintable(strCase));
}